

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::TensorValue_RepeatedFloats::TensorValue_RepeatedFloats
          (TensorValue_RepeatedFloats *this,TensorValue_RepeatedFloats *from)

{
  TensorValue_RepeatedFloats *from_local;
  TensorValue_RepeatedFloats *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__TensorValue_RepeatedFloats_006f0610;
  google::protobuf::RepeatedField<float>::RepeatedField(&this->values_,&from->values_);
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

TensorValue_RepeatedFloats::TensorValue_RepeatedFloats(const TensorValue_RepeatedFloats& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      values_(from.values_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.MILSpec.TensorValue.RepeatedFloats)
}